

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsCurveGeometry.h
# Opt level: O3

void anurbs::NurbsCurveGeometry<3l>::
     register_python<pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>>
               (module *m,class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *model)

{
  class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
  *pcVar1;
  string name;
  class_<anurbs::NurbsCurveGeometry<3L>,_anurbs::CurveBase<3L>,_std::shared_ptr<anurbs::NurbsCurveGeometry<3L>_>_>
  local_280;
  bool local_271;
  arg local_270;
  arg local_260;
  arg local_250;
  long *local_240;
  long local_230 [2];
  code *local_220;
  undefined8 local_218;
  code *local_210;
  undefined8 local_208;
  arg local_200;
  arg local_1f0;
  arg local_1e0;
  arg local_1d0;
  arg local_1c0;
  arg_v local_1b0;
  arg local_170;
  code *local_160;
  undefined8 local_158;
  arg local_150;
  arg local_140;
  code *local_130;
  undefined8 local_128;
  arg local_120;
  code *local_110;
  undefined8 local_108;
  arg local_100;
  code *local_f0;
  undefined8 local_e8;
  code *local_e0;
  undefined8 local_d8;
  code *local_d0;
  undefined8 local_c8;
  code *local_c0;
  undefined8 local_b8;
  code *local_b0;
  undefined8 local_a8;
  code *local_a0;
  undefined8 local_98;
  code *local_90;
  undefined8 local_88;
  code *local_80;
  undefined8 local_78;
  arg local_70;
  arg local_60;
  arg local_50;
  arg local_40;
  
  python_name_abi_cxx11_();
  pybind11::
  class_<anurbs::NurbsCurveGeometry<3L>,_anurbs::CurveBase<3L>,_std::shared_ptr<anurbs::NurbsCurveGeometry<3L>_>_>
  ::class_<>(&local_280,(m->super_object).super_handle.m_ptr,(char *)local_240);
  local_260.name = "degree";
  local_260._8_1_ = 2;
  local_270.name = "nb_poles";
  local_270._8_1_ = 2;
  local_271 = false;
  local_250.name = "is_rational";
  local_250._8_1_ = 2;
  pybind11::arg_v::arg_v<bool>(&local_1b0,&local_250,&local_271,(char *)0x0);
  pybind11::
  class_<anurbs::NurbsCurveGeometry<3L>,_anurbs::CurveBase<3L>,_std::shared_ptr<anurbs::NurbsCurveGeometry<3L>_>_>
  ::
  def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_oberbichler[P]ANurbs_external_libraries_pybind11_include_pybind11_detail_init_h:173:28),_pybind11::detail::is_new_style_constructor,_pybind11::arg,_pybind11::arg,_pybind11::arg_v>
            (&local_280,"__init__",(type *)&local_250,(is_new_style_constructor *)&local_1c0,
             &local_260,&local_270,&local_1b0);
  local_250.name = "degree";
  local_250._8_1_ = 2;
  local_1c0.name = "knots";
  local_1c0._8_1_ = 2;
  local_40.name = "poles";
  local_40._8_1_ = 2;
  pybind11::
  class_<anurbs::NurbsCurveGeometry<3L>,_anurbs::CurveBase<3L>,_std::shared_ptr<anurbs::NurbsCurveGeometry<3L>_>_>
  ::
  def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_oberbichler[P]ANurbs_external_libraries_pybind11_include_pybind11_detail_init_h:173:28),_pybind11::detail::is_new_style_constructor,_pybind11::arg,_pybind11::arg,_pybind11::arg>
            (&local_280,"__init__",(type *)&local_1d0,(is_new_style_constructor *)&local_1e0,
             &local_250,&local_1c0,&local_40);
  local_1d0.name = "degree";
  local_1d0._8_1_ = 2;
  local_1e0.name = "knots";
  local_1e0._8_1_ = 2;
  local_50.name = "poles";
  local_50._8_1_ = 2;
  local_60.name = "weights";
  local_60._8_1_ = 2;
  pybind11::
  class_<anurbs::NurbsCurveGeometry<3L>,_anurbs::CurveBase<3L>,_std::shared_ptr<anurbs::NurbsCurveGeometry<3L>_>_>
  ::
  def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_oberbichler[P]ANurbs_external_libraries_pybind11_include_pybind11_detail_init_h:173:28),_pybind11::detail::is_new_style_constructor,_pybind11::arg,_pybind11::arg,_pybind11::arg,_pybind11::arg>
            (&local_280,"__init__",(type *)&local_1f0,(is_new_style_constructor *)&local_200,
             &local_1d0,&local_1e0,&local_50,&local_60);
  local_1f0.name = "degree";
  local_1f0._8_1_ = 2;
  local_200.name = "knots";
  local_200._8_1_ = 2;
  local_70.name = "control_points";
  local_70._8_1_ = 2;
  pybind11::
  class_<anurbs::NurbsCurveGeometry<3L>,_anurbs::CurveBase<3L>,_std::shared_ptr<anurbs::NurbsCurveGeometry<3L>_>_>
  ::
  def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_oberbichler[P]ANurbs_external_libraries_pybind11_include_pybind11_detail_init_h:173:28),_pybind11::detail::is_new_style_constructor,_pybind11::arg,_pybind11::arg,_pybind11::arg>
            (&local_280,"__init__",(type *)&local_210,(is_new_style_constructor *)&local_220,
             &local_1f0,&local_200,&local_70);
  local_210 = NurbsCurveGeometry<3L>::is_rational;
  local_208 = 0;
  pcVar1 = (class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
              ::def_property_readonly<bool(anurbs::NurbsCurveGeometry<3l>::*)()const>
                        ((class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
                          *)&local_280,"is_rational",(offset_in_Model_to_subr *)&local_210);
  local_220 = NurbsCurveGeometry<3L>::nb_knots;
  local_218 = 0;
  pcVar1 = (class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
              ::def_property_readonly<long(anurbs::NurbsCurveGeometry<3l>::*)()const>
                        (pcVar1,"nb_knots",(offset_in_Model_to_subr *)&local_220);
  local_80 = NurbsCurveGeometry<3L>::nb_poles;
  local_78 = 0;
  pcVar1 = (class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
              ::def_property_readonly<long(anurbs::NurbsCurveGeometry<3l>::*)()const>
                        (pcVar1,"nb_poles",(offset_in_Model_to_subr *)&local_80);
  local_90 = NurbsCurveGeometry<3L>::knots;
  local_88 = 0;
  local_a0 = NurbsCurveGeometry<3L>::set_knots;
  local_98 = 0;
  pcVar1 = (class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
              ::
              def_property<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>(anurbs::NurbsCurveGeometry<3l>::*)(),void(anurbs::NurbsCurveGeometry<3l>::*)(Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>)>
                        (pcVar1,"knots",(offset_in_Model_to_subr *)&local_90,
                         (offset_in_Model_to_subr *)&local_a0);
  local_b0 = NurbsCurveGeometry<3L>::poles;
  local_a8 = 0;
  local_c0 = NurbsCurveGeometry<3L>::set_poles;
  local_b8 = 0;
  pcVar1 = (class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
              ::
              def_property<Eigen::Ref<Eigen::Matrix<double,_1,3,1,_1,3>,0,Eigen::OuterStride<_1>>(anurbs::NurbsCurveGeometry<3l>::*)(),void(anurbs::NurbsCurveGeometry<3l>::*)(Eigen::Ref<Eigen::Matrix<double,_1,3,1,_1,3>const,0,Eigen::OuterStride<_1>>)>
                        (pcVar1,"poles",(offset_in_Model_to_subr *)&local_b0,
                         (offset_in_Model_to_subr *)&local_c0);
  local_d0 = NurbsCurveGeometry<3L>::weights;
  local_c8 = 0;
  local_e0 = NurbsCurveGeometry<3L>::set_weights;
  local_d8 = 0;
  pcVar1 = (class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
              ::
              def_property<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>(anurbs::NurbsCurveGeometry<3l>::*)(),void(anurbs::NurbsCurveGeometry<3l>::*)(Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>)>
                        (pcVar1,"weights",(offset_in_Model_to_subr *)&local_d0,
                         (offset_in_Model_to_subr *)&local_e0);
  local_f0 = NurbsCurveGeometry<3L>::greville_point;
  local_e8 = 0;
  local_100.name = "index";
  local_100._8_1_ = 2;
  pcVar1 = (class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
              ::def<double(anurbs::NurbsCurveGeometry<3l>::*)(long)const,pybind11::arg>
                        (pcVar1,"greville_point",(offset_in_Model_to_subr *)&local_f0,&local_100);
  local_110 = NurbsCurveGeometry<3L>::nonzero_pole_indices_at_span;
  local_108 = 0;
  local_120.name = "span";
  local_120._8_1_ = 2;
  pcVar1 = (class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
              ::
              def<std::vector<long,std::allocator<long>>(anurbs::NurbsCurveGeometry<3l>::*)(long)const,pybind11::arg>
                        (pcVar1,"nonzero_pole_indices_at_span",(offset_in_Model_to_subr *)&local_110
                         ,&local_120);
  local_130 = NurbsCurveGeometry<3L>::shape_functions_at;
  local_128 = 0;
  local_140.name = "t";
  local_140._8_1_ = 2;
  local_150.name = "order";
  local_150._8_1_ = 2;
  pcVar1 = (class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
              ::
              def<std::pair<std::vector<long,std::allocator<long>>,Eigen::Matrix<double,_1,_1,1,_1,_1>>(anurbs::NurbsCurveGeometry<3l>::*)(double,long)const,pybind11::arg,pybind11::arg>
                        (pcVar1,"shape_functions_at",(offset_in_Model_to_subr *)&local_130,
                         &local_140,&local_150);
  local_160 = NurbsCurveGeometry<3L>::span_at;
  local_158 = 0;
  local_170.name = "t";
  local_170._8_1_ = 2;
  pybind11::
  class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
  ::def<long(anurbs::NurbsCurveGeometry<3l>::*)(double)const,pybind11::arg>
            (pcVar1,"span_at",(offset_in_Model_to_subr *)&local_160,&local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0.type._M_dataplus._M_p != &local_1b0.type.field_2) {
    operator_delete(local_1b0.type._M_dataplus._M_p,local_1b0.type.field_2._M_allocated_capacity + 1
                   );
  }
  pybind11::object::~object(&local_1b0.value);
  pybind11::object::~object((object *)&local_280);
  Model::register_python_data_type<anurbs::NurbsCurveGeometry<3l>>(m,model);
  if (local_240 != local_230) {
    operator_delete(local_240,local_230[0] + 1);
  }
  return;
}

Assistant:

static void register_python(pybind11::module& m, TModel& model)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        using Type = NurbsCurveGeometry<TDimension>;
        using Base = CurveBase<TDimension>; 
        using Holder = Pointer<Type>;

        const std::string name = Type::python_name();

        py::class_<Type, Base, Holder>(m, name.c_str())
            // constructors
            .def(py::init<const Index, const Index, const bool>(), "degree"_a, "nb_poles"_a, "is_rational"_a=false)
            .def(py::init<const Index, const Knots, const Poles>(), "degree"_a, "knots"_a, "poles"_a)
            .def(py::init<const Index, const Knots, const Poles, const Weights>(), "degree"_a, "knots"_a, "poles"_a, "weights"_a)
            .def(py::init<const Index, const Knots, const std::vector<ControlPoint>>(), "degree"_a, "knots"_a, "control_points"_a)
            // read-only properties
            .def_property_readonly("is_rational", &Type::is_rational)
            .def_property_readonly("nb_knots", &Type::nb_knots)
            .def_property_readonly("nb_poles", &Type::nb_poles)
            // properties
            .def_property("knots", py::overload_cast<>(&Type::knots), &Type::set_knots)
            .def_property("poles", py::overload_cast<>(&Type::poles), &Type::set_poles)
            .def_property("weights", py::overload_cast<>(&Type::weights), &Type::set_weights)
            // methods
            .def("greville_point", &Type::greville_point, "index"_a)
            .def("nonzero_pole_indices_at_span", &Type::nonzero_pole_indices_at_span, "span"_a)
            .def("shape_functions_at", &Type::shape_functions_at, "t"_a, "order"_a)
            .def("span_at", &Type::span_at, "t"_a)
            // .def("clone", &Type::clone)
        ;

        Model::register_python_data_type<Type>(m, model);
    }